

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_rst_stream(lws *wsi,uint32_t err,char *reason)

{
  lws_h2_netconn *plVar1;
  lws *plVar2;
  lws_h2_protocol_send *pps;
  int iVar3;
  
  plVar2 = lws_get_network_wsi(wsi);
  plVar1 = (plVar2->h2).h2n;
  iVar3 = 0;
  if ((plVar1 != (lws_h2_netconn *)0x0) &&
     (((wsi->field_0x2dc & 0x10) != 0 || (iVar3 = 0, plVar1->type != '\n')))) {
    iVar3 = 0;
    pps = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (pps == (lws_h2_protocol_send *)0x0) {
      iVar3 = 1;
    }
    else {
      pps->type = LWS_H2_PPS_RST_STREAM;
      _lws_log(8,"%s: RST_STREAM 0x%x, sid %d, REASON \'%s\'\n","lws_h2_rst_stream",err,
               (ulong)(wsi->mux).my_sid,reason);
      (pps->u).rs.sid = (wsi->mux).my_sid;
      (pps->u).rs.err = err;
      lws_pps_schedule(wsi,pps);
      plVar1->type = '\n';
      lws_h2_state(wsi,LWS_H2_STATE_CLOSED);
    }
  }
  return iVar3;
}

Assistant:

int
lws_h2_rst_stream(struct lws *wsi, uint32_t err, const char *reason)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	struct lws_h2_netconn *h2n = nwsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (!h2n)
		return 0;

	if (!wsi->h2_stream_carries_ws && h2n->type == LWS_H2_FRAME_TYPE_COUNT)
		return 0;

	pps = lws_h2_new_pps(LWS_H2_PPS_RST_STREAM);
	if (!pps)
		return 1;

	lwsl_info("%s: RST_STREAM 0x%x, sid %d, REASON '%s'\n", __func__,
		  (int)err, wsi->mux.my_sid, reason);

	pps->u.rs.sid = wsi->mux.my_sid;
	pps->u.rs.err = err;

	lws_pps_schedule(wsi, pps);

	h2n->type = LWS_H2_FRAME_TYPE_COUNT; /* ie, IGNORE */
	lws_h2_state(wsi, LWS_H2_STATE_CLOSED);

	return 0;
}